

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  char word_b [1024];
  char word_a [1024];
  
  puts("Please input two words to be displayed vertically:");
  do {
    printf("> ");
    pcVar6 = fgets(word_a,0x400,_stdin);
    if (pcVar6 == (char *)0x0) {
      return 1;
    }
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    pcVar6 = fgets(word_b,0x400,_stdin);
    if (pcVar6 == (char *)0x0) {
      return 1;
    }
  } while (word_b[0] == '\n');
  lVar7 = 0;
  bVar3 = true;
  bVar5 = true;
  do {
    if (bVar3) {
      cVar1 = word_a[lVar7];
      bVar2 = false;
      if ((cVar1 != '\0') && (bVar2 = false, cVar1 != '\n')) {
        printf("%c ",(ulong)(uint)(int)cVar1);
        bVar2 = bVar3;
      }
    }
    else {
      printf("  ");
      bVar2 = bVar3;
    }
    bVar4 = bVar5;
    if (bVar5) {
      cVar1 = word_b[lVar7];
      bVar4 = false;
      if ((cVar1 != '\0') && (cVar1 != '\n')) {
        putchar((int)cVar1);
        bVar4 = bVar5;
      }
    }
    putchar(10);
    lVar7 = lVar7 + 1;
    bVar3 = bVar2;
    bVar5 = bVar4;
  } while (bVar2 || bVar4);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Please input two words to be displayed vertically:\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  bool keep_printing_a = true;
  bool keep_printing_b = true;
  size_t n = 0;
  do {
    if (keep_printing_a) {
      if (word_a[n] != 0 && word_a[n] != '\n') printf("%c ", word_a[n]);
      else keep_printing_a = false;
    } else {
      printf("  ");
    }

    if (keep_printing_b) {
      if (word_b[n] != 0 && word_b[n] != '\n') printf("%c", word_b[n]);
      else keep_printing_b = false;
    }

    printf("\n");
    n++;
  } while (keep_printing_a || keep_printing_b);

  return 0;
}